

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::GELU_x86_avx::forward_inplace(GELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  float fVar13;
  float fVar14;
  float fVar15;
  long lVar16;
  undefined1 (*pauVar17) [32];
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float in_register_0000125c;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar36;
  float fVar38;
  float fVar40;
  undefined1 auVar31 [16];
  float fVar35;
  float fVar37;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  float fVar39;
  undefined1 auVar34 [32];
  
  if ((this->super_GELU).fast_gelu != 0) {
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar22 = 0;
    uVar21 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar21 = uVar22;
    }
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar17 = (undefined1 (*) [32])(sVar3 * uVar22 * sVar2 + (long)pvVar1);
      lVar20 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar18; iVar19 = iVar19 + 8) {
        fVar13 = *(float *)*pauVar17;
        fVar28 = *(float *)(*pauVar17 + 4);
        fVar36 = *(float *)(*pauVar17 + 8);
        fVar38 = *(float *)(*pauVar17 + 0xc);
        fVar40 = *(float *)(*pauVar17 + 0x10);
        fVar14 = *(float *)(*pauVar17 + 0x14);
        fVar15 = *(float *)(*pauVar17 + 0x18);
        auVar4._4_4_ = (fVar28 * fVar28 * fVar28 * 0.044715 + fVar28) * 0.7978845;
        auVar4._0_4_ = (fVar13 * fVar13 * fVar13 * 0.044715 + fVar13) * 0.7978845;
        auVar4._8_4_ = (fVar36 * fVar36 * fVar36 * 0.044715 + fVar36) * 0.7978845;
        auVar4._12_4_ = (fVar38 * fVar38 * fVar38 * 0.044715 + fVar38) * 0.7978845;
        auVar4._16_4_ = (fVar40 * fVar40 * fVar40 * 0.044715 + fVar40) * 0.7978845;
        auVar4._20_4_ = (fVar14 * fVar14 * fVar14 * 0.044715 + fVar14) * 0.7978845;
        auVar4._24_4_ = (fVar15 * fVar15 * fVar15 * 0.044715 + fVar15) * 0.7978845;
        auVar4._28_4_ = in_register_0000125c + *(float *)(*pauVar17 + 0x1c);
        auVar32._8_4_ = 0xc1100000;
        auVar32._0_8_ = 0xc1100000c1100000;
        auVar32._12_4_ = 0xc1100000;
        auVar32._16_4_ = 0xc1100000;
        auVar32._20_4_ = 0xc1100000;
        auVar32._24_4_ = 0xc1100000;
        auVar32._28_4_ = 0xc1100000;
        auVar4 = vmaxps_avx(auVar32,auVar4);
        auVar33._8_4_ = 0x41100000;
        auVar33._0_8_ = 0x4110000041100000;
        auVar33._12_4_ = 0x41100000;
        auVar33._16_4_ = 0x41100000;
        auVar33._20_4_ = 0x41100000;
        auVar33._24_4_ = 0x41100000;
        auVar33._28_4_ = 0x41100000;
        auVar4 = vminps_avx(auVar33,auVar4);
        fVar5 = auVar4._0_4_;
        fVar27 = fVar5 * fVar5;
        fVar23 = auVar4._4_4_;
        fVar35 = fVar23 * fVar23;
        fVar6 = auVar4._8_4_;
        fVar37 = fVar6 * fVar6;
        fVar7 = auVar4._12_4_;
        fVar39 = fVar7 * fVar7;
        fVar8 = auVar4._16_4_;
        fVar41 = fVar8 * fVar8;
        fVar9 = auVar4._20_4_;
        fVar42 = fVar9 * fVar9;
        fVar10 = auVar4._24_4_;
        fVar43 = fVar10 * fVar10;
        auVar11._4_4_ =
             ((((((fVar35 * -2.7607684e-16 + 2.000188e-13) * fVar35 + -8.604672e-11) * fVar35 +
                5.1222973e-08) * fVar35 + 1.48572235e-05) * fVar35 + 0.00063726195) * fVar35 +
             0.0048935246) * fVar23;
        auVar11._0_4_ =
             ((((((fVar27 * -2.7607684e-16 + 2.000188e-13) * fVar27 + -8.604672e-11) * fVar27 +
                5.1222973e-08) * fVar27 + 1.48572235e-05) * fVar27 + 0.00063726195) * fVar27 +
             0.0048935246) * fVar5;
        auVar11._8_4_ =
             ((((((fVar37 * -2.7607684e-16 + 2.000188e-13) * fVar37 + -8.604672e-11) * fVar37 +
                5.1222973e-08) * fVar37 + 1.48572235e-05) * fVar37 + 0.00063726195) * fVar37 +
             0.0048935246) * fVar6;
        auVar11._12_4_ =
             ((((((fVar39 * -2.7607684e-16 + 2.000188e-13) * fVar39 + -8.604672e-11) * fVar39 +
                5.1222973e-08) * fVar39 + 1.48572235e-05) * fVar39 + 0.00063726195) * fVar39 +
             0.0048935246) * fVar7;
        auVar11._16_4_ =
             ((((((fVar41 * -2.7607684e-16 + 2.000188e-13) * fVar41 + -8.604672e-11) * fVar41 +
                5.1222973e-08) * fVar41 + 1.48572235e-05) * fVar41 + 0.00063726195) * fVar41 +
             0.0048935246) * fVar8;
        auVar11._20_4_ =
             ((((((fVar42 * -2.7607684e-16 + 2.000188e-13) * fVar42 + -8.604672e-11) * fVar42 +
                5.1222973e-08) * fVar42 + 1.48572235e-05) * fVar42 + 0.00063726195) * fVar42 +
             0.0048935246) * fVar9;
        auVar11._24_4_ =
             ((((((fVar43 * -2.7607684e-16 + 2.000188e-13) * fVar43 + -8.604672e-11) * fVar43 +
                5.1222973e-08) * fVar43 + 1.48572235e-05) * fVar43 + 0.00063726195) * fVar43 +
             0.0048935246) * fVar10;
        auVar11._28_4_ = auVar4._28_4_;
        auVar34._0_4_ =
             ((fVar27 * 1.1982584e-06 + 0.00011853471) * fVar27 + 0.0022684347) * fVar27 +
             0.0048935246;
        auVar34._4_4_ =
             ((fVar35 * 1.1982584e-06 + 0.00011853471) * fVar35 + 0.0022684347) * fVar35 +
             0.0048935246;
        auVar34._8_4_ =
             ((fVar37 * 1.1982584e-06 + 0.00011853471) * fVar37 + 0.0022684347) * fVar37 +
             0.0048935246;
        auVar34._12_4_ =
             ((fVar39 * 1.1982584e-06 + 0.00011853471) * fVar39 + 0.0022684347) * fVar39 +
             0.0048935246;
        auVar34._16_4_ =
             ((fVar41 * 1.1982584e-06 + 0.00011853471) * fVar41 + 0.0022684347) * fVar41 +
             0.0048935246;
        auVar34._20_4_ =
             ((fVar42 * 1.1982584e-06 + 0.00011853471) * fVar42 + 0.0022684347) * fVar42 +
             0.0048935246;
        auVar34._24_4_ =
             ((fVar43 * 1.1982584e-06 + 0.00011853471) * fVar43 + 0.0022684347) * fVar43 +
             0.0048935246;
        auVar34._28_4_ = 0x4110140b;
        auVar4 = vdivps_avx(auVar11,auVar34);
        in_register_0000125c = auVar4._28_4_ + 1.0;
        auVar12._4_4_ = fVar28 * 0.5 * (auVar4._4_4_ + 1.0);
        auVar12._0_4_ = fVar13 * 0.5 * (auVar4._0_4_ + 1.0);
        auVar12._8_4_ = fVar36 * 0.5 * (auVar4._8_4_ + 1.0);
        auVar12._12_4_ = fVar38 * 0.5 * (auVar4._12_4_ + 1.0);
        auVar12._16_4_ = fVar40 * 0.5 * (auVar4._16_4_ + 1.0);
        auVar12._20_4_ = fVar14 * 0.5 * (auVar4._20_4_ + 1.0);
        auVar12._24_4_ = fVar15 * 0.5 * (auVar4._24_4_ + 1.0);
        auVar12._28_4_ = *(float *)(*pauVar17 + 0x1c);
        *pauVar17 = auVar12;
        pauVar17 = pauVar17 + 1;
        lVar20 = lVar20 + 8;
      }
      for (; iVar19 + 3 < iVar18; iVar19 = iVar19 + 4) {
        fVar8 = *(float *)*pauVar17;
        fVar9 = *(float *)(*pauVar17 + 4);
        fVar10 = *(float *)(*pauVar17 + 8);
        fVar13 = *(float *)(*pauVar17 + 0xc);
        auVar25._0_4_ = (fVar8 * fVar8 * fVar8 * 0.044715 + fVar8) * 0.7978845;
        auVar25._4_4_ = (fVar9 * fVar9 * fVar9 * 0.044715 + fVar9) * 0.7978845;
        auVar25._8_4_ = (fVar10 * fVar10 * fVar10 * 0.044715 + fVar10) * 0.7978845;
        auVar25._12_4_ = (fVar13 * fVar13 * fVar13 * 0.044715 + fVar13) * 0.7978845;
        auVar29._8_4_ = 0xc1100000;
        auVar29._0_8_ = 0xc1100000c1100000;
        auVar29._12_4_ = 0xc1100000;
        auVar25 = vmaxps_avx(auVar29,auVar25);
        auVar30._8_4_ = 0x41100000;
        auVar30._0_8_ = 0x4110000041100000;
        auVar30._12_4_ = 0x41100000;
        auVar25 = vminps_avx(auVar30,auVar25);
        fVar5 = auVar25._0_4_;
        fVar28 = fVar5 * fVar5;
        fVar23 = auVar25._4_4_;
        fVar36 = fVar23 * fVar23;
        fVar6 = auVar25._8_4_;
        fVar38 = fVar6 * fVar6;
        fVar7 = auVar25._12_4_;
        fVar40 = fVar7 * fVar7;
        auVar26._0_4_ =
             ((((((fVar28 * -2.7607684e-16 + 2.000188e-13) * fVar28 + -8.604672e-11) * fVar28 +
                5.1222973e-08) * fVar28 + 1.48572235e-05) * fVar28 + 0.00063726195) * fVar28 +
             0.0048935246) * fVar5;
        auVar26._4_4_ =
             ((((((fVar36 * -2.7607684e-16 + 2.000188e-13) * fVar36 + -8.604672e-11) * fVar36 +
                5.1222973e-08) * fVar36 + 1.48572235e-05) * fVar36 + 0.00063726195) * fVar36 +
             0.0048935246) * fVar23;
        auVar26._8_4_ =
             ((((((fVar38 * -2.7607684e-16 + 2.000188e-13) * fVar38 + -8.604672e-11) * fVar38 +
                5.1222973e-08) * fVar38 + 1.48572235e-05) * fVar38 + 0.00063726195) * fVar38 +
             0.0048935246) * fVar6;
        auVar26._12_4_ =
             ((((((fVar40 * -2.7607684e-16 + 2.000188e-13) * fVar40 + -8.604672e-11) * fVar40 +
                5.1222973e-08) * fVar40 + 1.48572235e-05) * fVar40 + 0.00063726195) * fVar40 +
             0.0048935246) * fVar7;
        auVar31._0_4_ =
             ((fVar28 * 1.1982584e-06 + 0.00011853471) * fVar28 + 0.0022684347) * fVar28 +
             0.0048935246;
        auVar31._4_4_ =
             ((fVar36 * 1.1982584e-06 + 0.00011853471) * fVar36 + 0.0022684347) * fVar36 +
             0.0048935246;
        auVar31._8_4_ =
             ((fVar38 * 1.1982584e-06 + 0.00011853471) * fVar38 + 0.0022684347) * fVar38 +
             0.0048935246;
        auVar31._12_4_ =
             ((fVar40 * 1.1982584e-06 + 0.00011853471) * fVar40 + 0.0022684347) * fVar40 +
             0.0048935246;
        auVar25 = vdivps_avx(auVar26,auVar31);
        in_register_0000125c = 0.0;
        auVar24._0_4_ = fVar8 * 0.5 * (auVar25._0_4_ + 1.0);
        auVar24._4_4_ = fVar9 * 0.5 * (auVar25._4_4_ + 1.0);
        auVar24._8_4_ = fVar10 * 0.5 * (auVar25._8_4_ + 1.0);
        auVar24._12_4_ = fVar13 * 0.5 * (auVar25._12_4_ + 1.0);
        *(undefined1 (*) [16])*pauVar17 = auVar24;
        pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
        lVar20 = lVar20 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar22;
      for (; (int)lVar20 < iVar18; lVar20 = lVar20 + 1) {
        fVar5 = *(float *)((long)pvVar1 + lVar20 * 4 + lVar16);
        in_register_0000125c = 0.0;
        fVar23 = tanhf((fVar5 * fVar5 * 0.044715 * fVar5 + fVar5) * 0.7978845);
        *(float *)((long)pvVar1 + lVar20 * 4 + lVar16) = (fVar23 + 1.0) * fVar5 * 0.5;
      }
    }
    return 0;
  }
  iVar18 = GELU::forward_inplace(&this->super_GELU,bottom_top_blob,opt);
  return iVar18;
}

Assistant:

int GELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}